

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

uint64_t Imf_3_4::anon_unknown_3::readVariableLengthInteger(char **readPtr,char *endPtr)

{
  byte bVar1;
  byte *pbVar2;
  byte bVar3;
  InputExc *this;
  ulong in_RSI;
  ulong *in_RDI;
  uint64_t value;
  uchar byte;
  int shift;
  ulong local_20;
  
  bVar3 = 0;
  local_20 = 0;
  do {
    if (in_RSI <= *in_RDI) {
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(this,"IDManifest too small for variable length integer");
      __cxa_throw(this,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    pbVar2 = (byte *)*in_RDI;
    *in_RDI = (ulong)(pbVar2 + 1);
    bVar1 = *pbVar2;
    local_20 = (long)(int)(bVar1 & 0x7f) << (bVar3 & 0x3f) | local_20;
    bVar3 = bVar3 + 7;
  } while ((bVar1 & 0x80) != 0);
  return local_20;
}

Assistant:

uint64_t
readVariableLengthInteger (const char*& readPtr, const char* endPtr)
{
    // bytes are stored LSB first, so each byte that is read from the stream must be
    // shifted before mixing into the existing length
    int           shift = 0;
    unsigned char byte  = 0;
    uint64_t      value = 0;
    do
    {
        if (readPtr >= endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for variable length integer");
        }
        byte = *(unsigned char*) readPtr++;
        // top bit of byte isn't part of actual number, it just indicates there's more info to come
        // so take bottom 7 bits, shift them to the right place, and insert them
        //
        value |= (uint64_t (byte & 127)) << shift;
        shift += 7;
    } while (byte &
             128); //while top bit set on previous byte, there is more to come
    return value;
}